

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall duckdb::PhysicalLimit::GetGlobalSourceState(PhysicalLimit *this,ClientContext *context)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0xf0);
  *(undefined1 *)(pp_Var1 + 1) = 1;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__LimitSourceState_01997da0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)(pp_Var1 + 0x14);
  pp_Var1[0xf] = (_func_int *)0x1;
  pp_Var1[0x10] = (_func_int *)0x0;
  pp_Var1[0x11] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var1 + 0x12) = 0x3f800000;
  pp_Var1[0x13] = (_func_int *)0x0;
  pp_Var1[0x14] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0x15) = 0;
  pp_Var1[0x1b] = (_func_int *)0x0;
  pp_Var1[0x1c] = (_func_int *)0x0;
  pp_Var1[0x1d] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 10) = 0;
  pp_Var1[0xb] = (_func_int *)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         this;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalLimit::GetGlobalSourceState(ClientContext &context) const {
	return make_uniq<LimitSourceState>();
}